

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitResumeThrow(InternalAnalyzer *this,ResumeThrow *curr)

{
  bool bVar1;
  ResumeThrow *curr_local;
  InternalAnalyzer *this_local;
  
  this->parent->calls = true;
  this->parent->implicitTrap = true;
  bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
  if ((bVar1) && (this->parent->tryDepth == 0)) {
    this->parent->throws_ = true;
  }
  return;
}

Assistant:

void visitResumeThrow(ResumeThrow* curr) {
      // This acts as a kitchen sink effect.
      parent.calls = true;

      // resume_throw instructions accept nullable continuation
      // references and trap on null.
      parent.implicitTrap = true;

      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
    }